

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shell.cpp
# Opt level: O0

char * csv_read_one_field(ImportCtx *p)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  char *pcVar4;
  undefined8 *in_RDI;
  int cQuote;
  int startLine;
  int ppc;
  int pc;
  int rSep;
  int cSep;
  int c;
  int in_stack_ffffffffffffffcc;
  uint in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  uint uVar5;
  uint local_24;
  uint local_20;
  uint uVar6;
  
  uVar6 = *(uint *)((long)in_RDI + 0x3c);
  uVar1 = *(uint *)(in_RDI + 8);
  *(undefined4 *)(in_RDI + 4) = 0;
  uVar2 = fgetc((FILE *)in_RDI[1]);
  if ((uVar2 == 0xffffffff) || (seenInterrupt != 0)) {
    *(undefined4 *)(in_RDI + 7) = 0xffffffff;
    return (char *)0x0;
  }
  if (uVar2 == 0x22) {
    uVar2 = *(uint *)(in_RDI + 5);
    local_24 = 0;
    local_20 = 0;
    uVar5 = 0x22;
    while( true ) {
      while( true ) {
        uVar3 = fgetc((FILE *)in_RDI[1]);
        if (uVar3 == uVar1) {
          *(int *)(in_RDI + 5) = *(int *)(in_RDI + 5) + 1;
        }
        if ((uVar3 != uVar5) || (local_20 != uVar5)) break;
        local_20 = 0;
      }
      if (((((uVar3 == uVar6) && (local_20 == uVar5)) || ((uVar3 == uVar1 && (local_20 == uVar5))))
          || ((uVar3 == uVar1 && ((local_20 == 0xd && (local_24 == uVar5)))))) ||
         ((uVar3 == 0xffffffff && (local_20 == uVar5)))) goto LAB_001df75a;
      if ((local_20 == uVar5) && (uVar3 != 0xd)) {
        fprintf(_stderr,"%s:%d: unescaped %c character\n",*in_RDI,(ulong)*(uint *)(in_RDI + 5),
                (ulong)uVar5);
      }
      if (uVar3 == 0xffffffff) break;
      import_append_char((ImportCtx *)CONCAT44(uVar5,in_stack_ffffffffffffffd0),
                         in_stack_ffffffffffffffcc);
      local_24 = local_20;
      local_20 = uVar3;
    }
    fprintf(_stderr,"%s:%d: unterminated %c-quoted field\n",*in_RDI,(ulong)uVar2,(ulong)uVar5);
    *(uint *)(in_RDI + 7) = uVar3;
  }
  else {
    if (((uVar2 & 0xff) == 0xef) && (*(int *)((long)in_RDI + 0x34) == 0)) {
      import_append_char((ImportCtx *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                         in_stack_ffffffffffffffcc);
      uVar2 = fgetc((FILE *)in_RDI[1]);
      if ((uVar2 & 0xff) == 0xbb) {
        import_append_char((ImportCtx *)
                           CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                           in_stack_ffffffffffffffcc);
        uVar2 = fgetc((FILE *)in_RDI[1]);
        if ((uVar2 & 0xff) == 0xbf) {
          *(undefined4 *)((long)in_RDI + 0x34) = 1;
          *(undefined4 *)(in_RDI + 4) = 0;
          pcVar4 = csv_read_one_field((ImportCtx *)CONCAT44(uVar2,uVar6));
          return pcVar4;
        }
      }
    }
    while( true ) {
      uVar5 = in_stack_ffffffffffffffd0 & 0xffffff;
      if ((uVar2 != 0xffffffff) && (uVar5 = in_stack_ffffffffffffffd0 & 0xffffff, uVar2 != uVar6)) {
        uVar5 = CONCAT13(uVar2 != uVar1,(int3)in_stack_ffffffffffffffd0);
      }
      in_stack_ffffffffffffffd0 = uVar5;
      if ((char)(in_stack_ffffffffffffffd0 >> 0x18) == '\0') break;
      import_append_char((ImportCtx *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                         in_stack_ffffffffffffffcc);
      uVar2 = fgetc((FILE *)in_RDI[1]);
    }
    if (((uVar2 == uVar1) &&
        (*(int *)(in_RDI + 5) = *(int *)(in_RDI + 5) + 1, 0 < *(int *)(in_RDI + 4))) &&
       (*(char *)(in_RDI[3] + (long)(*(int *)(in_RDI + 4) + -1)) == '\r')) {
      *(int *)(in_RDI + 4) = *(int *)(in_RDI + 4) + -1;
    }
    *(uint *)(in_RDI + 7) = uVar2;
  }
LAB_001df9a5:
  if (in_RDI[3] != 0) {
    *(undefined1 *)(in_RDI[3] + (long)*(int *)(in_RDI + 4)) = 0;
  }
  *(undefined4 *)((long)in_RDI + 0x34) = 1;
  return (char *)in_RDI[3];
LAB_001df75a:
  do {
    *(int *)(in_RDI + 4) = *(int *)(in_RDI + 4) + -1;
  } while ((int)*(char *)(in_RDI[3] + (long)*(int *)(in_RDI + 4)) != uVar5);
  *(uint *)(in_RDI + 7) = uVar3;
  goto LAB_001df9a5;
}

Assistant:

static char *SQLITE_CDECL csv_read_one_field(ImportCtx *p) {
	int c;
	int cSep = p->cColSep;
	int rSep = p->cRowSep;
	p->n = 0;
	c = fgetc(p->in);
	if (c == EOF || seenInterrupt) {
		p->cTerm = EOF;
		return 0;
	}
	if (c == '"') {
		int pc, ppc;
		int startLine = p->nLine;
		int cQuote = c;
		pc = ppc = 0;
		while (1) {
			c = fgetc(p->in);
			if (c == rSep)
				p->nLine++;
			if (c == cQuote) {
				if (pc == cQuote) {
					pc = 0;
					continue;
				}
			}
			if ((c == cSep && pc == cQuote) || (c == rSep && pc == cQuote) ||
			    (c == rSep && pc == '\r' && ppc == cQuote) || (c == EOF && pc == cQuote)) {
				do {
					p->n--;
				} while (p->z[p->n] != cQuote);
				p->cTerm = c;
				break;
			}
			if (pc == cQuote && c != '\r') {
				utf8_printf(stderr, "%s:%d: unescaped %c character\n", p->zFile, p->nLine, cQuote);
			}
			if (c == EOF) {
				utf8_printf(stderr, "%s:%d: unterminated %c-quoted field\n", p->zFile, startLine, cQuote);
				p->cTerm = c;
				break;
			}
			import_append_char(p, c);
			ppc = pc;
			pc = c;
		}
	} else {
		/* If this is the first field being parsed and it begins with the
		** UTF-8 BOM  (0xEF BB BF) then skip the BOM */
		if ((c & 0xff) == 0xef && p->bNotFirst == 0) {
			import_append_char(p, c);
			c = fgetc(p->in);
			if ((c & 0xff) == 0xbb) {
				import_append_char(p, c);
				c = fgetc(p->in);
				if ((c & 0xff) == 0xbf) {
					p->bNotFirst = 1;
					p->n = 0;
					return csv_read_one_field(p);
				}
			}
		}
		while (c != EOF && c != cSep && c != rSep) {
			import_append_char(p, c);
			c = fgetc(p->in);
		}
		if (c == rSep) {
			p->nLine++;
			if (p->n > 0 && p->z[p->n - 1] == '\r')
				p->n--;
		}
		p->cTerm = c;
	}
	if (p->z)
		p->z[p->n] = 0;
	p->bNotFirst = 1;
	return p->z;
}